

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.c
# Opt level: O0

LONGLONG quick_select_longlong(LONGLONG *arr,int n)

{
  LONGLONG LVar1;
  int iVar2;
  int iVar3;
  LONGLONG t_6;
  LONGLONG t_5;
  LONGLONG t_4;
  LONGLONG t_3;
  LONGLONG t_2;
  LONGLONG t_1;
  LONGLONG t;
  int local_30;
  int hh;
  int ll;
  int middle;
  int median;
  int high;
  int low;
  int n_local;
  LONGLONG *arr_local;
  
  median = 0;
  middle = n + -1;
  iVar2 = middle / 2;
  while( true ) {
    if (middle <= median) {
      return arr[iVar2];
    }
    if (middle == median + 1) break;
    iVar3 = (median + middle) / 2;
    if (arr[middle] < arr[iVar3]) {
      LVar1 = arr[iVar3];
      arr[iVar3] = arr[middle];
      arr[middle] = LVar1;
    }
    if (arr[middle] < arr[median]) {
      LVar1 = arr[median];
      arr[median] = arr[middle];
      arr[middle] = LVar1;
    }
    if (arr[median] < arr[iVar3]) {
      LVar1 = arr[iVar3];
      arr[iVar3] = arr[median];
      arr[median] = LVar1;
    }
    LVar1 = arr[iVar3];
    arr[iVar3] = arr[median + 1];
    arr[median + 1] = LVar1;
    local_30 = median + 1;
    t._4_4_ = middle;
    while( true ) {
      do {
        local_30 = local_30 + 1;
        iVar3 = t._4_4_;
      } while (arr[local_30] < arr[median]);
      do {
        t._4_4_ = iVar3;
        iVar3 = t._4_4_ + -1;
      } while (arr[median] < arr[iVar3]);
      if (iVar3 < local_30) break;
      LVar1 = arr[local_30];
      arr[local_30] = arr[iVar3];
      arr[iVar3] = LVar1;
      t._4_4_ = iVar3;
    }
    LVar1 = arr[median];
    arr[median] = arr[iVar3];
    arr[iVar3] = LVar1;
    if (iVar3 <= iVar2) {
      median = local_30;
    }
    if (iVar2 <= iVar3) {
      middle = t._4_4_ + -2;
    }
  }
  if (arr[middle] < arr[median]) {
    LVar1 = arr[median];
    arr[median] = arr[middle];
    arr[middle] = LVar1;
  }
  return arr[iVar2];
}

Assistant:

static LONGLONG quick_select_longlong(LONGLONG arr[], int n) 
{
    int low, high ;
    int median;
    int middle, ll, hh;

    low = 0 ; high = n-1 ; median = (low + high) / 2;
    for (;;) {
        if (high <= low) /* One element only */
            return arr[median] ;

        if (high == low + 1) {  /* Two elements only */
            if (arr[low] > arr[high])
                ELEM_SWAP(arr[low], arr[high]) ;
            return arr[median] ;
        }

    /* Find median of low, middle and high items; swap into position low */
    middle = (low + high) / 2;
    if (arr[middle] > arr[high])    ELEM_SWAP(arr[middle], arr[high]) ;
    if (arr[low] > arr[high])       ELEM_SWAP(arr[low], arr[high]) ;
    if (arr[middle] > arr[low])     ELEM_SWAP(arr[middle], arr[low]) ;

    /* Swap low item (now in position middle) into position (low+1) */
    ELEM_SWAP(arr[middle], arr[low+1]) ;

    /* Nibble from each end towards middle, swapping items when stuck */
    ll = low + 1;
    hh = high;
    for (;;) {
        do ll++; while (arr[low] > arr[ll]) ;
        do hh--; while (arr[hh]  > arr[low]) ;

        if (hh < ll)
        break;

        ELEM_SWAP(arr[ll], arr[hh]) ;
    }

    /* Swap middle item (in position low) back into correct position */
    ELEM_SWAP(arr[low], arr[hh]) ;

    /* Re-set active partition */
    if (hh <= median)
        low = ll;
        if (hh >= median)
        high = hh - 1;
    }
}